

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ShellLinkAndJumpListHandler.cpp
# Opt level: O2

void __thiscall
ShellLinkAndJumpListHandler::parseLNKStruct
          (ShellLinkAndJumpListHandler *this,
          vector<unsigned_char,_std::allocator<unsigned_char>_> *headerValue)

{
  bool bVar1;
  int iVar2;
  int iVar3;
  ostream *poVar4;
  _Vector_base<unsigned_char,_std::allocator<unsigned_char>_> local_50;
  int local_38;
  bool bStack_34;
  undefined3 uStack_33;
  
  ReadStream::read((ReadStream *)&stack0xffffffffffffffc8,(int)this->rs,
                   (void *)(ulong)(this->startPosition + 4),4);
  std::vector<unsigned_char,_std::allocator<unsigned_char>_>::_M_move_assign
            (headerValue,(ReadStream *)&stack0xffffffffffffffc8);
  std::_Vector_base<unsigned_char,_std::allocator<unsigned_char>_>::~_Vector_base
            ((_Vector_base<unsigned_char,_std::allocator<unsigned_char>_> *)&stack0xffffffffffffffc8
            );
  std::vector<unsigned_char,_std::allocator<unsigned_char>_>::vector
            ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)&local_50,headerValue);
  iVar2 = Utils::lenFourBytesChar
                    ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)&local_50);
  std::_Vector_base<unsigned_char,_std::allocator<unsigned_char>_>::~_Vector_base(&local_50);
  if (iVar2 == 0x1140200) {
    poVar4 = std::operator<<((ostream *)&std::cout,"[ShellLink structure ");
    *(uint *)(poVar4 + *(long *)(*(long *)poVar4 + -0x18) + 0x18) =
         *(uint *)(poVar4 + *(long *)(*(long *)poVar4 + -0x18) + 0x18) & 0xffffffb5 | 2;
    poVar4 = (ostream *)std::ostream::operator<<(poVar4,this->countOfShellLink + 1);
    std::operator<<(poVar4,"]: ");
    local_38 = 0;
    bStack_34 = false;
    uStack_33 = 0;
    ShellLink::parseShellLinkStructure
              ((ShellLink *)&stack0xffffffffffffffc8,this->rs,this->startPosition);
    iVar3 = ShellLink::getShellLinkOffsetEnd((ShellLink *)&stack0xffffffffffffffc8);
    iVar2 = (iVar3 - iVar3 % 0x10) + 0xc;
    if (iVar3 % 0x10 == 0) {
      iVar2 = iVar3 + -4;
    }
    this->startPosition = iVar2;
    this->countOfShellLink = this->countOfShellLink + 1;
    bVar1 = ShellLink::isThisShellLinkHasErrors((ShellLink *)&stack0xffffffffffffffc8);
    if (bVar1) {
      this->countOfShellLinkWithErrors = this->countOfShellLinkWithErrors + 1;
    }
    ShellLink::resetAllFlags((ShellLink *)&stack0xffffffffffffffc8);
    poVar4 = std::endl<char,std::char_traits<char>>((ostream *)&std::cout);
    poVar4 = std::endl<char,std::char_traits<char>>(poVar4);
    std::endl<char,std::char_traits<char>>(poVar4);
  }
  else {
    this->startPosition = this->startPosition + 4;
  }
  return;
}

Assistant:

void ShellLinkAndJumpListHandler::parseLNKStruct(std::vector<unsigned char> headerValue) {
    /* Decode ShellLink Stream = CustDest Jump List */
    headerValue =  rs->read(startPosition + 4,4);
    if (Utils::lenFourBytesChar(headerValue) != 0x01140200) { // Если следующее поле не CLSID -> ищем структуры далее
        startPosition += 4;
        return;
    }
    cout << "[ShellLink structure " << dec << countOfShellLink + 1 << "]: ";
    ShellLink shellLink = ShellLink();
    shellLink.parseShellLinkStructure(rs, startPosition);
    int offsetEnd = shellLink.getShellLinkOffsetEnd();
    int remainder = offsetEnd % 16;
    startPosition = remainder == 0 ? offsetEnd - 4 : offsetEnd + 12 - remainder;  // так как в while будет + 4
    ++countOfShellLink;
    if(shellLink.isThisShellLinkHasErrors())
        ++countOfShellLinkWithErrors;
    shellLink.resetAllFlags();
    cout << endl << endl << endl;
    return;
}